

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O2

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,unsigned_int>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,uint *args_1)

{
  SHA512_CTX *ctx;
  sha512_half_hasher h;
  SHA512_CTX SStack_f8;
  
  SHA512_Init(&SStack_f8);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short,unsigned_int>
            ((basic_sha512_half_hasher<false> *)&SStack_f8,(unsigned_short *)this,(uint *)args);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&SStack_f8);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}